

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ObtainHandleForObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,IPalObject *pobj,
          DWORD dwRightsRequested,bool fInheritHandle,IPalProcess *pProcessForHandle,
          HANDLE *pNewHandle)

{
  PAL_ERROR PVar1;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e7);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pobj == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e8);
    fprintf(_stderr,"Expression: NULL != pobj\n");
  }
  if (pNewHandle == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e9);
    fprintf(_stderr,"Expression: NULL != pNewHandle\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (pProcessForHandle == (IPalProcess *)0x0) {
      PVar1 = CSimpleHandleManager::AllocateHandle
                        (&this->m_HandleManager,pthr,pobj,dwRightsRequested,fInheritHandle,
                         pNewHandle);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00133cea;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x2fd);
      fprintf(_stderr,"Caller to ObtainHandleForObject provided a process\n");
      PVar1 = 0x78;
    }
    return PVar1;
  }
LAB_00133cea:
  abort();
}

Assistant:

PAL_ERROR   
CSharedMemoryObjectManager::ObtainHandleForObject(
    CPalThread *pthr,
    IPalObject *pobj,
    DWORD dwRightsRequested,
    bool fInheritHandle,
    IPalProcess *pProcessForHandle,     // IN, OPTIONAL
    HANDLE *pNewHandle                  // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pobj);
    _ASSERTE(NULL != pNewHandle);

    ENTRY("CSharedMemoryObjectManager::ObtainHandleForObject "
        "(this=%p, pthr=%p, pobj=%p, dwRightsRequested=%d, "
        "fInheritHandle=%p, pProcessForHandle=%p, pNewHandle=%p)\n",
        this,
        pthr,
        pobj,
        dwRightsRequested,
        fInheritHandle,
        pProcessForHandle,
        pNewHandle
        );

    if (NULL != pProcessForHandle)
    {
        //
        // Not yet supported
        //

        ASSERT("Caller to ObtainHandleForObject provided a process\n");
        return ERROR_CALL_NOT_IMPLEMENTED;
    }

    palError = m_HandleManager.AllocateHandle(
        pthr,
        pobj,
        dwRightsRequested,
        fInheritHandle,
        pNewHandle
        );

    LOGEXIT("CSharedMemoryObjectManager::ObtainHandleForObject return %d\n", palError);

    return palError;    
}